

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall
UDPSplitAddrPacketReader::UDPSplitAddrPacketReader
          (UDPSplitAddrPacketReader *this,void **vtt,Socket *socket,int max,int mtu)

{
  list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  *plVar1;
  sockfd_t sVar2;
  void *pvVar3;
  
  sVar2 = socket->sockfd;
  pvVar3 = vtt[1];
  *(void **)&this->super_UDPSplitPacketReader = pvVar3;
  *(void **)((this->reply_addr).__ss_padding + *(long *)((long)pvVar3 + -0x30) + -0x42) = vtt[2];
  *(void **)((this->reply_addr).__ss_padding +
            *(long *)(*(long *)&this->super_UDPSplitPacketReader + -0x20) + -0x42) = vtt[3];
  plVar1 = &(this->super_UDPSplitPacketReader).receivedPackets;
  (this->super_UDPSplitPacketReader).receivedPackets.
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_UDPSplitPacketReader).receivedPackets.
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_UDPSplitPacketReader).receivedPackets.
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_UDPSplitPacketReader).currentPacket._M_node = (_List_node_base *)0x0;
  (this->super_UDPSplitPacketReader).socket = sVar2;
  (this->super_UDPSplitPacketReader).max = max;
  (this->super_UDPSplitPacketReader).mtu = mtu;
  (this->super_UDPSplitPacketReader).receivedPacket = false;
  pvVar3 = *vtt;
  *(void **)&this->super_UDPSplitPacketReader = pvVar3;
  *(void **)((this->reply_addr).__ss_padding + *(long *)((long)pvVar3 + -0x30) + -0x42) = vtt[4];
  *(void **)((this->reply_addr).__ss_padding +
            *(long *)(*(long *)&this->super_UDPSplitPacketReader + -0x20) + -0x42) = vtt[5];
  return;
}

Assistant:

UDPSplitAddrPacketReader::UDPSplitAddrPacketReader(Socket &socket, int max, int mtu) : UDPSplitPacketReader(socket.sockfd, max, mtu) {}